

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O1

float float_of_substring(substring s)

{
  size_t sVar1;
  char *pcVar2;
  char *p;
  anon_union_4_2_947300a4 x;
  float fVar3;
  char *endptr;
  char *local_50 [2];
  char local_40 [16];
  char *local_30;
  
  pcVar2 = s.end;
  p = s.begin;
  local_30 = pcVar2;
  fVar3 = parseFloat(p,&local_30,(char *)0x0);
  if ((p != pcVar2 && local_30 == p) || ((~(uint)fVar3 & 0x7fc00000) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"warning: ",9);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,p,pcVar2);
    pcVar2 = local_50[0];
    if (local_50[0] == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2d25d8);
    }
    else {
      sVar1 = strlen(local_50[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," is not a good float, replacing with 0",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    fVar3 = 0.0;
  }
  return fVar3;
}

Assistant:

inline float float_of_substring(substring s)
{
  char* endptr = s.end;
  float f = parseFloat(s.begin, &endptr);
  if ((endptr == s.begin && s.begin != s.end) || nanpattern(f))
  {
    std::cout << "warning: " << std::string(s.begin, s.end - s.begin).c_str()
              << " is not a good float, replacing with 0" << std::endl;
    f = 0;
  }
  return f;
}